

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChKblockGeneric.cpp
# Opt level: O2

void __thiscall
chrono::ChKblockGeneric::ChKblockGeneric
          (ChKblockGeneric *this,ChVariables *mvariableA,ChVariables *mvariableB)

{
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  ChVariables *local_60;
  undefined1 local_58 [16];
  pointer local_48;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_38;
  ChVariables *local_20;
  
  (this->super_ChKblock)._vptr_ChKblock = (_func_int **)&PTR__ChKblockGeneric_01186748;
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = ZEXT416(0) << 0x40;
  local_48 = (pointer)0x0;
  local_60 = mvariableB;
  local_20 = mvariableA;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::push_back
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_58,
             &local_20);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::push_back
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_58,
             &local_60);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_38,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_58);
  SetVariables(this,(vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
                    &local_38);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_38);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            ((_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)local_58
            );
  return;
}

Assistant:

ChKblockGeneric::ChKblockGeneric(ChVariables* mvariableA, ChVariables* mvariableB) {
    std::vector<ChVariables*> mvars;
    mvars.push_back(mvariableA);
    mvars.push_back(mvariableB);
    SetVariables(mvars);
}